

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void CVmBifNet::get_hostname(uint oargc)

{
  int iVar1;
  char buf [256];
  int server_level;
  int client_level;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int local_c;
  int local_8 [2];
  
  CVmBif::check_argc(0,0x2512bc);
  (*G_host_ifc_X->_vptr_CVmHostIfc[5])(G_host_ifc_X,local_8,&local_c);
  if ((local_8[0] < 2) || (local_c < 2)) {
    if ((local_8[0] < 1) || (local_c < 1)) {
      iVar1 = os_get_hostname(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (iVar1 == 0) {
        CVmBif::retval_nil();
      }
      else {
        CVmBif::retval_ui_str(in_stack_fffffffffffffef0);
      }
    }
    else {
      CVmBif::retval_str(in_stack_fffffffffffffef0);
    }
  }
  else {
    CVmBif::retval_nil();
  }
  return;
}

Assistant:

void CVmBifNet::get_hostname(VMG_ uint oargc)
{
    /* check arguments */
    check_argc(vmg_ oargc, 0);

    /* check the network safety levels */
    int client_level, server_level;
    G_host_ifc->get_net_safety(&client_level, &server_level);

    /* 
     *   If the network safety level doesn't allow outside network access for
     *   either client or server, return "localhost".  If they don't allow
     *   any network access at all, return nil.
     *   
     *   If there's a host name defined in the web configuration, return that
     *   host name.  Otherwise, return the default host name from the OS.  
     */
    if (client_level >= VM_NET_SAFETY_MAXIMUM
        && server_level >= VM_NET_SAFETY_MAXIMUM)
    {
        /* no network access is allowed - return nil */
        retval_nil(vmg0_);
    }
    else if (client_level >= VM_NET_SAFETY_LOCALHOST
        && server_level >= VM_NET_SAFETY_LOCALHOST)
    {
        /* localhost access only - return "localhost" */
        retval_str(vmg_ "localhost");
    }
    else
    {
        /* 
         *   the network safety level allows outside network access, so we
         *   can return the actual host name - get it from the system
         */
        char buf[256];
        if (os_get_hostname(buf, sizeof(buf)))
        {
            /* got it - return the string */
            retval_ui_str(vmg_ buf);
        }
        else
        {
            /* no host name available - return nil */
            retval_nil(vmg0_);
        }
    }
}